

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_ldm_blockCompress
                 (rawSeqStore_t *rawSeqStore,ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 void *src,size_t srcSize)

{
  U32 minMatch_00;
  ZSTD_strategy strat;
  BYTE *dst;
  ZSTD_dictMode_e dictMode;
  ZSTD_blockCompressor p_Var1;
  BYTE *pBVar2;
  long lVar3;
  size_t sVar4;
  BYTE *dst_00;
  BYTE *ip_00;
  rawSeq rVar5;
  size_t newLitLength;
  int i;
  uint local_100;
  U32 local_f4;
  uint uStack_f0;
  rawSeq sequence;
  BYTE *ip;
  BYTE *iend;
  BYTE *istart;
  ZSTD_blockCompressor blockCompressor;
  uint minMatch;
  ZSTD_compressionParameters *cParams;
  size_t srcSize_local;
  void *src_local;
  U32 *rep_local;
  seqStore_t *seqStore_local;
  ZSTD_matchState_t *ms_local;
  rawSeqStore_t *rawSeqStore_local;
  BYTE *litEnd;
  BYTE *litLimit_w;
  BYTE *oend;
  BYTE *op;
  BYTE *ip_1;
  ptrdiff_t diff;
  
  minMatch_00 = (ms->cParams).minMatch;
  strat = (ms->cParams).strategy;
  dictMode = ZSTD_matchState_dictMode(ms);
  p_Var1 = ZSTD_selectBlockCompressor(strat,dictMode);
  pBVar2 = (BYTE *)((long)src + srcSize);
  if (rawSeqStore->size < rawSeqStore->pos) {
    __assert_fail("rawSeqStore->pos <= rawSeqStore->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x456d,
                  "size_t ZSTD_ldm_blockCompress(rawSeqStore_t *, ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                 );
  }
  sequence._4_8_ = src;
  if (rawSeqStore->capacity < rawSeqStore->size) {
    __assert_fail("rawSeqStore->size <= rawSeqStore->capacity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x456e,
                  "size_t ZSTD_ldm_blockCompress(rawSeqStore_t *, ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                 );
  }
  for (; rawSeqStore->pos < rawSeqStore->size && (ulong)sequence._4_8_ < pBVar2;
      sequence._4_8_ = sequence._4_8_ + (ulong)uStack_f0 + (ulong)local_100) {
    ip._0_4_ = (int)pBVar2;
    rVar5 = maybeSplitSequence(rawSeqStore,(int)ip - sequence.litLength,minMatch_00);
    local_100 = rVar5.matchLength;
    local_f4 = rVar5.offset;
    if (local_f4 == 0) break;
    uStack_f0 = rVar5.litLength;
    if (pBVar2 < (BYTE *)(sequence._4_8_ + (ulong)uStack_f0 + (ulong)local_100)) {
      __assert_fail("ip + sequence.litLength + sequence.matchLength <= iend",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4579,
                    "size_t ZSTD_ldm_blockCompress(rawSeqStore_t *, ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                   );
    }
    ZSTD_ldm_limitTableUpdate(ms,(BYTE *)sequence._4_8_);
    ZSTD_ldm_fillFastTables(ms,(void *)sequence._4_8_);
    sVar4 = (*p_Var1)(ms,seqStore,rep,(void *)sequence._4_8_,rVar5._4_8_);
    for (newLitLength._4_4_ = 2; 0 < newLitLength._4_4_;
        newLitLength._4_4_ = newLitLength._4_4_ + -1) {
      rep[newLitLength._4_4_] = rep[newLitLength._4_4_ + -1];
    }
    *rep = local_f4;
    ip_00 = (BYTE *)((sequence._4_8_ + (ulong)uStack_f0) - sVar4);
    if (seqStore->maxNbSeq <=
        (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x2038,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0x20000 < seqStore->maxNbLit) {
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x203a,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (seqStore->litStart + seqStore->maxNbLit < seqStore->lit + sVar4) {
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x203b,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (pBVar2 < ip_00 + sVar4) {
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x203c,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (pBVar2 + -0x20 < ip_00 + sVar4) {
      ZSTD_safecopyLiterals(seqStore->lit,ip_00,ip_00 + sVar4,pBVar2 + -0x20);
    }
    else {
      ZSTD_copy16(seqStore->lit,ip_00);
      if (0x10 < sVar4) {
        dst = seqStore->lit;
        dst_00 = dst + 0x10;
        lVar3 = (long)dst_00 - (long)(ip_00 + 0x10);
        if (lVar3 < 8 && -0x10 < lVar3) {
          __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x1268,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        if (lVar3 < 0x10 && -0x10 < lVar3) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x1270,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        ZSTD_copy16(dst_00,ip_00 + 0x10);
        while (dst = dst + 0x20, dst < dst_00 + (sVar4 - 0x10)) {
          op = ip_00 + 0x20;
          ZSTD_copy16(dst,op);
          ZSTD_copy16(dst + 0x10,ip_00 + 0x30);
          ip_00 = op;
        }
      }
    }
    seqStore->lit = seqStore->lit + sVar4;
    if (0xffff < sVar4) {
      if (seqStore->longLengthID != 0) {
        __assert_fail("seqStorePtr->longLengthID == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x204d,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      seqStore->longLengthID = 1;
      seqStore->longLengthPos =
           (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
    }
    seqStore->sequences->litLength = (U16)sVar4;
    seqStore->sequences->offset = local_f4 + 3;
    if (0xffff < local_100 - 3) {
      if (seqStore->longLengthID != 0) {
        __assert_fail("seqStorePtr->longLengthID == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2058,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      seqStore->longLengthID = 2;
      seqStore->longLengthPos =
           (U32)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3);
    }
    seqStore->sequences->matchLength = (U16)(local_100 - 3);
    seqStore->sequences = seqStore->sequences + 1;
  }
  ZSTD_ldm_limitTableUpdate(ms,(BYTE *)sequence._4_8_);
  ZSTD_ldm_fillFastTables(ms,(void *)sequence._4_8_);
  sVar4 = (*p_Var1)(ms,seqStore,rep,(void *)sequence._4_8_,(long)pBVar2 - sequence._4_8_);
  return sVar4;
}

Assistant:

size_t ZSTD_ldm_blockCompress(rawSeqStore_t* rawSeqStore,
    ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
    void const* src, size_t srcSize)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    unsigned const minMatch = cParams->minMatch;
    ZSTD_blockCompressor const blockCompressor =
        ZSTD_selectBlockCompressor(cParams->strategy, ZSTD_matchState_dictMode(ms));
    /* Input bounds */
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    /* Input positions */
    BYTE const* ip = istart;

    DEBUGLOG(5, "ZSTD_ldm_blockCompress: srcSize=%zu", srcSize);
    assert(rawSeqStore->pos <= rawSeqStore->size);
    assert(rawSeqStore->size <= rawSeqStore->capacity);
    /* Loop through each sequence and apply the block compressor to the lits */
    while (rawSeqStore->pos < rawSeqStore->size && ip < iend) {
        /* maybeSplitSequence updates rawSeqStore->pos */
        rawSeq const sequence = maybeSplitSequence(rawSeqStore,
                                                   (U32)(iend - ip), minMatch);
        int i;
        /* End signal */
        if (sequence.offset == 0)
            break;

        assert(ip + sequence.litLength + sequence.matchLength <= iend);

        /* Fill tables for block compressor */
        ZSTD_ldm_limitTableUpdate(ms, ip);
        ZSTD_ldm_fillFastTables(ms, ip);
        /* Run the block compressor */
        DEBUGLOG(5, "calling block compressor on segment of size %u", sequence.litLength);
        {
            size_t const newLitLength =
                blockCompressor(ms, seqStore, rep, ip, sequence.litLength);
            ip += sequence.litLength;
            /* Update the repcodes */
            for (i = ZSTD_REP_NUM - 1; i > 0; i--)
                rep[i] = rep[i-1];
            rep[0] = sequence.offset;
            /* Store the sequence */
            ZSTD_storeSeq(seqStore, newLitLength, ip - newLitLength, iend,
                          sequence.offset + ZSTD_REP_MOVE,
                          sequence.matchLength - MINMATCH);
            ip += sequence.matchLength;
        }
    }
    /* Fill the tables for the block compressor */
    ZSTD_ldm_limitTableUpdate(ms, ip);
    ZSTD_ldm_fillFastTables(ms, ip);
    /* Compress the last literals */
    return blockCompressor(ms, seqStore, rep, ip, iend - ip);
}